

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int findIndexCol(Parse *pParse,ExprList *pList,int iBase,Index *pIdx,int iCol)

{
  char *zRight;
  int iVar1;
  Expr *pEVar2;
  CollSeq *pCVar3;
  CollSeq *pColl;
  Expr *p;
  char *zColl;
  int i;
  int iCol_local;
  Index *pIdx_local;
  int iBase_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  zRight = pIdx->azColl[iCol];
  zColl._0_4_ = 0;
  do {
    if (pList->nExpr <= (int)zColl) {
      return -1;
    }
    pEVar2 = sqlite3ExprSkipCollate(pList->a[(int)zColl].pExpr);
    if (((pEVar2->op == 0xa2) && (pEVar2->iColumn == pIdx->aiColumn[iCol])) &&
       (pEVar2->iTable == iBase)) {
      pCVar3 = sqlite3ExprNNCollSeq(pParse,pList->a[(int)zColl].pExpr);
      iVar1 = sqlite3StrICmp(pCVar3->zName,zRight);
      if (iVar1 == 0) {
        return (int)zColl;
      }
    }
    zColl._0_4_ = (int)zColl + 1;
  } while( true );
}

Assistant:

static int findIndexCol(
  Parse *pParse,                  /* Parse context */
  ExprList *pList,                /* Expression list to search */
  int iBase,                      /* Cursor for table associated with pIdx */
  Index *pIdx,                    /* Index to match column of */
  int iCol                        /* Column of index to match */
){
  int i;
  const char *zColl = pIdx->azColl[iCol];

  for(i=0; i<pList->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollate(pList->a[i].pExpr);
    if( p->op==TK_COLUMN
     && p->iColumn==pIdx->aiColumn[iCol]
     && p->iTable==iBase
    ){
      CollSeq *pColl = sqlite3ExprNNCollSeq(pParse, pList->a[i].pExpr);
      if( 0==sqlite3StrICmp(pColl->zName, zColl) ){
        return i;
      }
    }
  }

  return -1;
}